

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>
::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::num_writer>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::num_writer>
             *this,back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *it)

{
  size_t *psVar1;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::num_writer>
  pVar2;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> __result;
  _List_node_base *p_Var3;
  long lVar4;
  
  __result = (back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>)it->container;
  if (*(long *)(this + 0x10) != 0) {
    __result = std::__copy_move<false,false,std::random_access_iterator_tag>::
               __copy_m<char_const*,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>>
                         (*(char **)(this + 8),*(char **)(this + 8) + *(long *)(this + 0x10),
                          __result);
    it->container = (list<char,_std::allocator<char>_> *)__result;
  }
  lVar4 = *(long *)(this + 0x20);
  if (lVar4 != 0) {
    pVar2 = this[0x18];
    do {
      p_Var3 = (_List_node_base *)operator_new(0x18);
      *(padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::num_writer>
        *)&p_Var3[1]._M_next = pVar2;
      std::__detail::_List_node_base::_M_hook(p_Var3);
      psVar1 = &((__result.container)->super__List_base<char,_std::allocator<char>_>)._M_impl.
                _M_node._M_size;
      *psVar1 = *psVar1 + 1;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  it->container = (list<char,_std::allocator<char>_> *)__result;
  int_writer<long_long,fmt::v5::basic_format_specs<char>>::num_writer::operator()
            ((num_writer *)(this + 0x28),it);
  return;
}

Assistant:

void operator()(It &&it) const {
      if (prefix.size() != 0)
        it = internal::copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }